

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.hpp
# Opt level: O0

int __thiscall BCL::init(BCL *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  error *this_00;
  int local_58;
  int local_54;
  int nprocs;
  int rank;
  allocator<char> local_39;
  string local_38;
  int local_18;
  byte local_11;
  int provided;
  bool thread_safe_local;
  uint64_t shared_segment_size_local;
  
  local_11 = (byte)ctx & 1;
  comm = &ompi_mpi_comm_world;
  shared_segment_size = (long)this << 0x14;
  _provided = this;
  bVar1 = mpi_initialized();
  if (!bVar1) {
    if ((local_11 & 1) == 0) {
      MPI_Init(0);
    }
    else {
      MPI_Init_thread(0,0,3,&local_18);
      if (local_18 < 3) {
        nprocs._3_1_ = 1;
        this_00 = (error *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,
                   "BCL Asked for MPI_THREAD_MULTIPLE, but was denied. You need a thread-safe MPI implementation."
                   ,&local_39);
        error::error(this_00,&local_38);
        nprocs._3_1_ = 0;
        __cxa_throw(this_00,&error::typeinfo,error::~error);
      }
    }
    we_initialized = 1;
  }
  MPI_Comm_rank(comm,&local_54);
  MPI_Comm_size(comm,&local_58);
  my_rank = (long)local_54;
  my_nprocs = (long)local_58;
  MPI_Info_create(&info);
  MPI_Info_set(info,"accumulate_ordering","none");
  MPI_Info_set(info,"accumulate_ops","same_op_no_op");
  MPI_Info_set(info,"same_size","true");
  MPI_Info_set(info,"same_disp_unit","true");
  MPI_Win_allocate(shared_segment_size,1,info,comm,&smem_base_ptr,&win);
  bcl_finalized = 0;
  init_malloc();
  MPI_Barrier(comm);
  MPI_Win_lock_all(0,win);
  barrier();
  return extraout_EAX;
}

Assistant:

void init(uint64_t shared_segment_size = 256, bool thread_safe = false) {
  BCL::comm = MPI_COMM_WORLD;
  BCL::shared_segment_size = 1024*1024*shared_segment_size;

  if (!mpi_initialized()) {
    if (!thread_safe) {
      MPI_Init(NULL, NULL);
    } else {
      int provided;
      MPI_Init_thread(NULL, NULL, MPI_THREAD_MULTIPLE, &provided);
      if (provided < MPI_THREAD_MULTIPLE) {
        throw BCL::error("BCL Asked for MPI_THREAD_MULTIPLE, but was denied. "
                         "You need a thread-safe MPI implementation.");
      }
    }
    we_initialized = true;
  }

  int rank, nprocs;
  MPI_Comm_rank(BCL::comm, &rank);
  MPI_Comm_size(BCL::comm, &nprocs);
  BCL::my_rank = rank;
  BCL::my_nprocs = nprocs;

  MPI_Info_create(&info);
  MPI_Info_set(info, "accumulate_ordering", "none");
  MPI_Info_set(info, "accumulate_ops", "same_op_no_op");
  MPI_Info_set(info, "same_size", "true");
  MPI_Info_set(info, "same_disp_unit", "true");

  MPI_Win_allocate(BCL::shared_segment_size, 1, info, BCL::comm,
    &smem_base_ptr, &win);

  bcl_finalized = false;

  init_malloc();

  MPI_Barrier(BCL::comm);
  MPI_Win_lock_all(0, win);
  BCL::barrier();
}